

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int isoent_gen_joliet_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  wchar_t wVar4;
  isoent *piVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  int *piVar9;
  isofile *piVar10;
  int iVar11;
  archive_rb_tree_ops *rbt_ops;
  isoent *piVar12;
  int weight;
  char *pcVar13;
  uchar *p;
  uint uVar14;
  isoent *piVar15;
  int iVar16;
  size_t __n;
  uint uVar17;
  
  iVar1 = (isoent->children).cnt;
  iVar3 = 0;
  if (iVar1 != 0) {
    pvVar2 = a->format_data;
    rbt_ops = (archive_rb_tree_ops *)0x80;
    if ((*(uint *)((long)pvVar2 + 0x10370) & 0x60000) == 0x40000) {
      rbt_ops = (archive_rb_tree_ops *)0xce;
    }
    iVar3 = idr_start(a,idr,iVar1,6,2,0x21d710,rbt_ops);
    if (-1 < iVar3) {
      uVar17 = 1;
      piVar15 = isoent->parent;
      piVar12 = isoent;
      if (isoent->parent != isoent) {
        do {
          piVar5 = piVar15;
          uVar17 = uVar17 + piVar12->mb_len + 1;
          piVar15 = piVar5->parent;
          piVar12 = piVar5;
        } while (piVar5->parent != piVar5);
      }
      piVar15 = (isoent->children).first;
      if (piVar15 != (isoent *)0x0) {
        uVar6 = (ulong)rbt_ops & 0xffffffff;
        iVar1 = (int)rbt_ops;
        do {
          piVar10 = piVar15->file;
          __n = (piVar10->basename_utf16).length;
          if ((int)rbt_ops < (int)__n) {
            __n = uVar6;
          }
          pcVar7 = (char *)malloc(__n * 2 + 2);
          if (pcVar7 == (char *)0x0) {
            pcVar7 = "Can\'t allocate memory";
LAB_00191972:
            archive_set_error(&a->archive,0xc,pcVar7);
            return -0x1e;
          }
          memcpy(pcVar7,(piVar10->basename_utf16).s,__n);
          pcVar13 = pcVar7 + __n;
          iVar3 = (int)pcVar13;
          (pcVar7 + __n)[0] = '\0';
          (pcVar7 + __n)[1] = '\0';
          piVar15->identifier = pcVar7;
          sVar8 = __n;
          if (__n != 0) {
            do {
              uVar14 = (uint)CONCAT11(*pcVar7,pcVar7[1]);
              if ((uVar14 < 0x20) ||
                 ((uVar14 = uVar14 - 0x2a, uVar14 < 0x33 &&
                  ((0x4000000230021U >> ((ulong)uVar14 & 0x3f) & 1) != 0)))) {
                pcVar7[0] = '\0';
                pcVar7[1] = '_';
              }
              else if ((*pcVar7 == '\0') && (pcVar7[1] == '.')) {
                pcVar13 = pcVar7;
              }
              iVar3 = (int)pcVar13;
              pcVar7 = pcVar7 + 2;
              sVar8 = sVar8 - 2;
            } while (sVar8 != 0);
            pcVar7 = piVar15->identifier;
          }
          iVar3 = iVar3 - (int)pcVar7;
          piVar15->ext_off = iVar3;
          iVar16 = (int)__n;
          piVar15->ext_len = iVar16 - iVar3;
          piVar15->id_len = iVar16;
          piVar10 = piVar15->file;
          if ((int)rbt_ops < (int)(piVar10->basename_utf16).length) {
            wVar4 = archive_strncpy_l((archive_string *)((long)pvVar2 + 0x60),pcVar7,__n,
                                      *(archive_string_conv **)((long)pvVar2 + 0x80));
            if ((wVar4 != L'\0') && (piVar9 = __errno_location(), *piVar9 == 0xc)) {
              pcVar7 = "No memory";
              goto LAB_00191972;
            }
            iVar11 = *(int *)((long)pvVar2 + 0x68);
            piVar15->mb_len = iVar11;
            piVar10 = piVar15->file;
            weight = iVar11;
            if (iVar11 == (int)(piVar10->basename).length) {
              weight = 0;
            }
          }
          else {
            iVar11 = (int)(piVar10->basename).length;
            piVar15->mb_len = iVar11;
            weight = 0;
          }
          if (0xf0 < (int)(iVar11 + uVar17)) {
            pcVar7 = archive_entry_pathname(piVar10->entry);
            archive_set_error(&a->archive,-1,
                              "The regulation of Joliet extensions; A length of a full-pathname of `%s\' is longer than 240 bytes, (p=%d, b=%d)"
                              ,pcVar7,(ulong)uVar17,(ulong)(uint)piVar15->mb_len);
            return -0x1e;
          }
          if ((int)rbt_ops == iVar16) {
            iVar11 = iVar3 + -6;
          }
          else if (iVar1 + -2 == iVar16) {
            iVar11 = iVar3 + -4;
          }
          else {
            iVar11 = iVar3 + -2;
            if (iVar1 + -4 != iVar16) {
              iVar11 = iVar3;
            }
          }
          idr_register(idr,piVar15,weight,iVar11);
          piVar15 = piVar15->chnext;
        } while (piVar15 != (isoent *)0x0);
      }
      idr_resolve(idr,idr_set_num_beutf16);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
isoent_gen_joliet_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	unsigned char *p;
	size_t l;
	int r;
	int ffmax, parent_len;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_joliet, isoent_cmp_key_joliet
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	if (iso9660->opt.joliet == OPT_JOLIET_LONGNAME)
		ffmax = 206;
	else
		ffmax = 128;

	r = idr_start(a, idr, isoent->children.cnt, ffmax, 6, 2, &rb_ops);
	if (r < 0)
		return (r);

	parent_len = 1;
	for (np = isoent; np->parent != np; np = np->parent)
		parent_len += np->mb_len + 1;

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		unsigned char *dot;
		int ext_off, noff, weight;
		size_t lt;

		if ((int)(l = np->file->basename_utf16.length) > ffmax)
			l = ffmax;

		p = malloc((l+1)*2);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename_utf16.s, l);
		p[l] = 0;
		p[l+1] = 0;

		np->identifier = (char *)p;
		lt = l;
		dot = p + l;
		weight = 0;
		while (lt > 0) {
			if (!joliet_allowed_char(p[0], p[1]))
				archive_be16enc(p, 0x005F); /* '_' */
			else if (p[0] == 0 && p[1] == 0x2E) /* '.' */
				dot = p;
			p += 2;
			lt -= 2;
		}
		ext_off = (int)(dot - (unsigned char *)np->identifier);
		np->ext_off = ext_off;
		np->ext_len = (int)l - ext_off;
		np->id_len = (int)l;

		/*
		 * Get a length of MBS of a full-pathname.
		 */
		if ((int)np->file->basename_utf16.length > ffmax) {
			if (archive_strncpy_l(&iso9660->mbs,
			    (const char *)np->identifier, l,
				iso9660->sconv_from_utf16be) != 0 &&
			    errno == ENOMEM) {
				archive_set_error(&a->archive, errno,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
			np->mb_len = (int)iso9660->mbs.length;
			if (np->mb_len != (int)np->file->basename.length)
				weight = np->mb_len;
		} else
			np->mb_len = (int)np->file->basename.length;

		/* If a length of full-pathname is longer than 240 bytes,
		 * it violates Joliet extensions regulation. */
		if (parent_len + np->mb_len > 240) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "The regulation of Joliet extensions;"
			    " A length of a full-pathname of `%s' is "
			    "longer than 240 bytes, (p=%d, b=%d)",
			    archive_entry_pathname(np->file->entry),
			    (int)parent_len, (int)np->mb_len);
			return (ARCHIVE_FATAL);
		}

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identifier. */
		if ((int)l == ffmax)
			noff = ext_off - 6;
		else if ((int)l == ffmax-2)
			noff = ext_off - 4;
		else if ((int)l == ffmax-4)
			noff = ext_off - 2;
		else
			noff = ext_off;
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier with Joliet Volume. */
	idr_resolve(idr, idr_set_num_beutf16);

	return (ARCHIVE_OK);
}